

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O1

void __thiscall leveldb::DBImpl::TEST_CompactRange(DBImpl *this,int level,Slice *begin,Slice *end)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  string *psVar3;
  InternalKey end_storage;
  InternalKey begin_storage;
  string local_f0;
  ManualCompaction local_d0;
  ParsedInternalKey local_98;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  local_50 = &local_40;
  psVar3 = (string *)0x0;
  local_48 = 0;
  local_40 = 0;
  local_70 = &local_60;
  local_68 = 0;
  local_60 = 0;
  paVar1 = &local_d0.tmp_storage.rep_.field_2;
  local_d0.tmp_storage.rep_._M_string_length = 0;
  local_d0.tmp_storage.rep_.field_2._M_local_buf[0] = '\0';
  local_d0.done = false;
  local_d0.level = level;
  local_d0.tmp_storage.rep_._M_dataplus._M_p = (pointer)paVar1;
  if (begin != (Slice *)0x0) {
    local_f0._M_string_length = 0;
    local_f0.field_2._M_local_buf[0] = '\0';
    local_98.user_key.data_ = begin->data_;
    local_98.user_key.size_ = begin->size_;
    local_98.sequence = 0xffffffffffffff;
    local_98.type = kTypeValue;
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    AppendInternalKey(&local_f0,&local_98);
    psVar3 = (string *)&local_50;
    std::__cxx11::string::operator=(psVar3,(string *)&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,
                      CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                               local_f0.field_2._M_local_buf[0]) + 1);
    }
  }
  local_d0.begin = (InternalKey *)psVar3;
  if (end == (Slice *)0x0) {
    psVar3 = (string *)0x0;
  }
  else {
    local_f0._M_string_length = 0;
    local_f0.field_2._M_local_buf[0] = '\0';
    local_98.user_key.data_ = end->data_;
    local_98.user_key.size_ = end->size_;
    local_98.sequence = 0;
    local_98.type = kTypeDeletion;
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    AppendInternalKey(&local_f0,&local_98);
    psVar3 = (string *)&local_70;
    std::__cxx11::string::operator=(psVar3,(string *)&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,
                      CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                               local_f0.field_2._M_local_buf[0]) + 1);
    }
  }
  local_d0.end = (InternalKey *)psVar3;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  if (local_d0.done == false) {
    do {
      if ((((this->shutting_down_)._M_base._M_i & 1U) != 0) ||
         ((this->bg_error_).state_ != (char *)0x0)) break;
      if (this->manual_compaction_ == (ManualCompaction *)0x0) {
        this->manual_compaction_ = &local_d0;
        MaybeScheduleCompaction(this);
      }
      else {
        local_98.user_key.data_ = (char *)(this->background_work_finished_signal_).mu_;
        local_98.user_key.size_ = CONCAT71(local_98.user_key.size_._1_7_,1);
        std::condition_variable::wait((unique_lock *)&this->background_work_finished_signal_);
      }
    } while (local_d0.done != true);
  }
  if (this->manual_compaction_ == &local_d0) {
    this->manual_compaction_ = (ManualCompaction *)0x0;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.tmp_storage.rep_._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0.tmp_storage.rep_._M_dataplus._M_p,
                    CONCAT71(local_d0.tmp_storage.rep_.field_2._M_allocated_capacity._1_7_,
                             local_d0.tmp_storage.rep_.field_2._M_local_buf[0]) + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  return;
}

Assistant:

void DBImpl::TEST_CompactRange(int level, const Slice* begin,
                               const Slice* end) {
  assert(level >= 0);
  assert(level + 1 < config::kNumLevels);

  InternalKey begin_storage, end_storage;

  ManualCompaction manual;
  manual.level = level;
  manual.done = false;
  if (begin == nullptr) {
    manual.begin = nullptr;
  } else {
    begin_storage = InternalKey(*begin, kMaxSequenceNumber, kValueTypeForSeek);
    manual.begin = &begin_storage;
  }
  if (end == nullptr) {
    manual.end = nullptr;
  } else {
    end_storage = InternalKey(*end, 0, static_cast<ValueType>(0));
    manual.end = &end_storage;
  }

  MutexLock l(&mutex_);
  while (!manual.done && !shutting_down_.load(std::memory_order_acquire) &&
         bg_error_.ok()) {
    if (manual_compaction_ == nullptr) {  // Idle
      manual_compaction_ = &manual;
      MaybeScheduleCompaction();
    } else {  // Running either my compaction or another compaction.
      background_work_finished_signal_.Wait();
    }
  }
  if (manual_compaction_ == &manual) {
    // Cancel my manual compaction since we aborted early for some reason.
    manual_compaction_ = nullptr;
  }
}